

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  Parser local_b2;
  allocator<char> local_b1;
  string local_b0;
  Balk balk;
  
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,argv[1],&local_b1);
    Parser::get_balk_from_file(&balk,&local_b2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    Balk::solve_balk(&balk);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,argv[2],(allocator<char> *)&local_b2);
    Balk::save_result(&balk,&local_b0,1000);
    std::__cxx11::string::~string((string *)&local_b0);
    Balk::~Balk(&balk);
    iVar1 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," \"<input_file_name>\" \"<output_folder_name>\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3) {
        std::cout << "Usage: " << argv[0] <<" \"<input_file_name>\" \"<output_folder_name>\"" << std::endl;
        return -1;
    }
    try
    {
        Balk balk = Parser().get_balk_from_file(argv[1]);
        balk.solve_balk();
        balk.save_result(argv[2]);
    }
    catch (const ParseError &e)
    {
        std::cout << e.what() << std::endl;
        return -1;
    }
    return 0;
}